

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

int google::protobuf::compiler::cpp::EstimateSize(FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  string *psVar5;
  bool bVar6;
  LogMessageFatal aLStack_18 [16];
  
  if (field == (FieldDescriptor *)0x0) {
    iVar4 = 0;
  }
  else {
    FVar1 = field[1];
    bVar6 = (bool)(((byte)FVar1 & 0x20) >> 5);
    if (0xbf < (byte)FVar1 == bVar6) {
      psVar5 = (string *)0x0;
    }
    else {
      psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar6,0xbf < (byte)FVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar5 != (string *)0x0) {
      EstimateSize();
LAB_001e7caa:
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
    }
    if (((byte)field[1] & 0x20) == 0) {
      switch(*(undefined4 *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4))
      {
      case 1:
      case 3:
      case 6:
      case 8:
        iVar4 = 4;
        break;
      case 2:
      case 4:
      case 5:
      case 10:
        iVar4 = 8;
        break;
      case 7:
        iVar4 = 1;
        break;
      case 9:
        iVar4 = google::protobuf::FieldDescriptor::cpp_string_type();
        iVar4 = (uint)(iVar4 == 2) * 8 + 8;
        break;
      default:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (aLStack_18,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/cpp/helpers.cc"
                   ,0x282);
        absl::lts_20240722::log_internal::LogMessage::operator<<
                  ((LogMessage *)aLStack_18,(char (*) [16])"Can\'t get here.");
        goto LAB_001e7caa;
      }
    }
    else {
      if ((field[2] == (FieldDescriptor)0xb) &&
         (cVar3 = google::protobuf::FieldDescriptor::is_map_message_type(), cVar3 != '\0')) {
        return 0x20;
      }
      iVar4 = 0x10;
      iVar2 = *(int *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
      if ((8 < iVar2) && (iVar4 = 0x18, iVar2 == 9)) {
        iVar4 = google::protobuf::FieldDescriptor::cpp_string_type();
        iVar4 = (uint)(iVar4 != 2) * 8 + 0x10;
      }
    }
  }
  return iVar4;
}

Assistant:

int EstimateSize(const FieldDescriptor* field) {
  if (field == nullptr) return 0;
  if (field->is_repeated()) {
    if (field->is_map()) {
      return sizeof(google::protobuf::Map<int32_t, int32_t>);
    }
    return field->cpp_type() < FieldDescriptor::CPPTYPE_STRING || IsCord(field)
               ? sizeof(RepeatedField<int32_t>)
               : sizeof(internal::RepeatedPtrFieldBase);
  }
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return 1;

    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_FLOAT:
      return 4;

    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT64:
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return 8;

    case FieldDescriptor::CPPTYPE_STRING:
      if (IsCord(field)) return sizeof(absl::Cord);
      return sizeof(internal::ArenaStringPtr);
  }
  ABSL_LOG(FATAL) << "Can't get here.";
  return -1;  // Make compiler happy.
}